

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O2

void __thiscall
trimesh::dataset_t::
get_mfold<(trimesh::eGDIR)0,boost::range_detail::transformed_range<boost::_bi::bind_t<int,boost::_mfi::cmf1<int,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::vector<int,std::allocator<int>>>>
          (dataset_t *this,mfold_t *mfold,
          transformed_range<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::vector<int,_std::allocator<int>_>_>
          *rng)

{
  reference c_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  _Elt_pointer piVar4;
  cellid_t *pcVar5;
  ostream *poVar6;
  runtime_error *this_00;
  long lVar7;
  cellid_t c;
  mfold_t *local_2e0;
  remove_cv_ref_t<decltype(boost::begin(rng))> b;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  string local_258 [32];
  remove_cv_ref_t<decltype(boost::end(rng))> e;
  cellid_t f [20];
  stringstream ss;
  undefined1 local_1b0 [384];
  
  local_2e0 = mfold;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&stk);
  boost::iterators::
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
  ::transform_iterator
            (&b,(transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
                 *)rng);
  boost::iterators::
  transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
  ::transform_iterator
            (&e,&(rng->
                 super_iterator_range<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>_>
                 ).
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                 .m_End);
  c_00 = boost::iterators::
         transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
         ::dereference(&b);
  iVar1 = cell_dim(this,c_00);
  while (b.super_type.m_iterator._M_current != e.super_type.m_iterator._M_current) {
    boost::iterators::operator++
              ((type *)&ss,
               (iterator_facade<boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>,_int,_boost::iterators::random_access_traversal_tag,_int,_long>
                *)&b,0);
    f[0] = boost::iterators::
           transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_int>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::use_default,_boost::use_default>
           ::dereference((type *)&ss);
    std::deque<int,_std::allocator<int>_>::emplace_back<int>(&stk.c,f);
    boost::optional_detail::
    optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
    ::~optional_base((optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                      *)local_1b0);
  }
  while( true ) {
    if (stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_cur) {
      boost::optional_detail::
      optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
      ::~optional_base((optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                        *)&e.m_f);
      boost::optional_detail::
      optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
      ::~optional_base((optional_base<boost::_bi::bind_t<int,_boost::_mfi::cmf1<int,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                        *)&b.m_f);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&stk);
      return;
    }
    piVar4 = stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_finish._M_first) {
      piVar4 = stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node[-1] + 0x80;
    }
    c = piVar4[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&stk.c);
    iVar2 = cell_dim(this,c);
    if (iVar2 != iVar1) break;
    std::vector<int,_std::allocator<int>_>::push_back(local_2e0,&c);
    uVar3 = get_cets<(trimesh::eGDIR)0>(this,c,f);
    for (lVar7 = 0; (ulong)uVar3 << 2 != lVar7; lVar7 = lVar7 + 4) {
      if ((this->m_cell_pairs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)f + lVar7)] != invalid_cellid) {
        pcVar5 = pair(this,*(int *)((long)f + lVar7));
        _ss = *pcVar5;
        if (_ss != c) {
          iVar2 = cell_dim(this,_ss);
          if (iVar2 == iVar1) {
            std::deque<int,_std::allocator<int>_>::push_back(&stk.c,(value_type_conflict2 *)&ss);
          }
        }
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar6 = std::operator<<((ostream *)(local_1b0 + 8),"Failed to assert condition ");
  poVar6 = std::operator<<(poVar6,"cell_dim(c) == dim");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"at (");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                          );
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = std::operator<<(poVar6,"get_mfold");
  poVar6 = std::operator<<(poVar6,",");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xca);
  std::operator<<(poVar6,") \n ");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_258);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void dataset_t::get_mfold(mfold_t &mfold,rng_t rng)
  {
    std::stack<cellid_t> stk;

    BOOST_AUTO(b,boost::begin(rng));
    BOOST_AUTO(e,boost::end(rng));

    int dim = cell_dim(*b);

    while ( b!= e) stk.push(*b++);

    cellid_t f[20],*fe,*fb;

    while(!stk.empty())
    {
      cellid_t c = stk.top(); stk.pop();

      ASSERT(cell_dim(c) == dim);

      mfold.push_back(c);

      fb = f; fe = f + get_cets<dir>(c,f);

      for (; fb != fe; ++fb )
        if( is_paired(*fb))
        {
          cellid_t p = pair(*fb);
          if(p != c && cell_dim(p) == dim)
            stk.push(p);
        }
    }
  }